

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::Compiler::type_struct_member_matrix_stride
          (Compiler *this,SPIRType *type,uint32_t index)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  runtime_error *prVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if (pMVar2 == (Meta *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Struct member does not have MatrixStride set.","");
    ::std::runtime_error::runtime_error(prVar3,(string *)local_40);
    *(undefined ***)prVar3 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pDVar1 = (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
  if ((pDVar1[index].decoration_flags.lower & 0x80) != 0) {
    return pDVar1[index].matrix_stride;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Struct member does not have MatrixStride set.","");
  ::std::runtime_error::runtime_error(prVar3,(string *)local_40);
  *(undefined ***)prVar3 = &PTR__runtime_error_00357118;
  __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

uint32_t Compiler::type_struct_member_matrix_stride(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.self);
	if (type_meta)
	{
		// Decoration must be set in valid SPIR-V, otherwise throw.
		// MatrixStride is part of OpMemberDecorate.
		auto &dec = type_meta->members[index];
		if (dec.decoration_flags.get(DecorationMatrixStride))
			return dec.matrix_stride;
		else
			SPIRV_CROSS_THROW("Struct member does not have MatrixStride set.");
	}
	else
		SPIRV_CROSS_THROW("Struct member does not have MatrixStride set.");
}